

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall google::protobuf::io::ArrayOutputStream::BackUp(ArrayOutputStream *this,int count)

{
  LogMessage *pLVar1;
  LogFinisher local_e2;
  byte local_e1;
  LogMessage local_e0;
  LogFinisher local_a2;
  byte local_a1;
  LogMessage local_a0;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  int local_14;
  ArrayOutputStream *pAStack_10;
  int count_local;
  ArrayOutputStream *this_local;
  
  local_51 = 0;
  local_14 = count;
  pAStack_10 = this;
  if (this->last_returned_size_ < 1) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x85);
    local_51 = 1;
    pLVar1 = internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (last_returned_size_) > (0): ");
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1,"BackUp() can only be called after a successful Next().");
    internal::LogFinisher::operator=(local_65,pLVar1);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  local_a1 = 0;
  if (this->last_returned_size_ < local_14) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x87);
    local_a1 = 1;
    pLVar1 = internal::LogMessage::operator<<
                       (&local_a0,"CHECK failed: (count) <= (last_returned_size_): ");
    internal::LogFinisher::operator=(&local_a2,pLVar1);
  }
  if ((local_a1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_a0);
  }
  local_e1 = 0;
  if (local_14 < 0) {
    internal::LogMessage::LogMessage
              (&local_e0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x88);
    local_e1 = 1;
    pLVar1 = internal::LogMessage::operator<<(&local_e0,"CHECK failed: (count) >= (0): ");
    internal::LogFinisher::operator=(&local_e2,pLVar1);
  }
  if ((local_e1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_e0);
  }
  this->position_ = this->position_ - local_14;
  this->last_returned_size_ = 0;
  return;
}

Assistant:

void ArrayOutputStream::BackUp(int count) {
  GOOGLE_CHECK_GT(last_returned_size_, 0)
      << "BackUp() can only be called after a successful Next().";
  GOOGLE_CHECK_LE(count, last_returned_size_);
  GOOGLE_CHECK_GE(count, 0);
  position_ -= count;
  last_returned_size_ = 0;  // Don't let caller back up further.
}